

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O2

void __thiscall Potassco::AspifTextInput::matchTerm(AspifTextInput *this)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  BufferedStream *pBVar5;
  
  pBVar5 = ProgramReader::stream(&this->super_ProgramReader);
  bVar1 = pBVar5->buf_[pBVar5->rpos_];
  iVar4 = islower((uint)bVar1);
  if ((bVar1 == 0x5f) || (iVar4 != 0)) {
    do {
      do {
        pBVar5 = ProgramReader::stream(&this->super_ProgramReader);
        cVar2 = BufferedStream::get(pBVar5);
        push(this,cVar2);
        pBVar5 = ProgramReader::stream(&this->super_ProgramReader);
        bVar1 = pBVar5->buf_[pBVar5->rpos_];
        iVar4 = isalnum((uint)bVar1);
      } while (bVar1 == 0x5f);
    } while (iVar4 != 0);
    skipws(this);
    bVar3 = match(this,"(",false);
    if (bVar3) {
      cVar2 = '(';
      do {
        push(this,cVar2);
        matchAtomArg(this);
        bVar3 = match(this,",",false);
        cVar2 = ',';
      } while (bVar3);
      match(this,")",true);
      push(this,')');
    }
  }
  else if (bVar1 == 0x22) {
    matchStr(this);
  }
  else {
    ProgramReader::require(&this->super_ProgramReader,false,"<term> expected");
  }
  skipws(this);
  return;
}

Assistant:

void AspifTextInput::matchTerm() {
	char c = stream()->peek();
	if (std::islower(static_cast<unsigned char>(c)) != 0 || c == '_') {
		do { push(stream()->get()); } while (std::isalnum(static_cast<unsigned char>(c = stream()->peek())) != 0 || c == '_');
		skipws();
		if (match("(", false)) {
			push('(');
			for (;;) {
				matchAtomArg();
				if (!match(",", false)) break;
				push(',');
			}
			match(")");
			push(')');
		}
	}
	else if (c == '"') { matchStr(); }
	else { require(false, "<term> expected"); }
	skipws();
}